

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_send_op.hpp
# Opt level: O2

void asio::detail::
     reactive_socket_send_op<asio::const_buffers_1,_asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>_>,_asio::any_io_executor>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  ptr p;
  handler_work<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>_>,_asio::any_io_executor,_void>
  w;
  binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>_>,_std::error_code,_unsigned_long>
  handler;
  ptr local_110;
  any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  local_f8;
  binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>_>,_std::error_code,_unsigned_long>
  local_c0;
  
  local_110.h = (write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>_>
                 *)(base + 4);
  local_110.v = (reactive_socket_send_op<asio::const_buffers_1,_asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>_>,_asio::any_io_executor>
                 *)base;
  local_110.p = (reactive_socket_send_op<asio::const_buffers_1,_asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>_>,_asio::any_io_executor>
                 *)base;
  execution::
  any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  ::any_executor(&local_f8,
                 (any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
                  *)&base[9].task_result_);
  binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>_>,_std::error_code,_unsigned_long>
  ::binder2(&local_c0,
            (write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffer,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>_>
             *)(base + 4),(error_code *)(base + 1),(unsigned_long *)(base + 2));
  local_110.h = &local_c0.handler_;
  ptr::reset(&local_110);
  if (owner != (void *)0x0) {
    handler_work<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::mutable_buffer,asio::mutable_buffer_const*,asio::detail::transfer_all_t,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::handshake_op,std::_Bind<void(nuraft::rpc_session::*(nuraft::rpc_session*,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>>>,asio::any_io_executor,void>
    ::
    complete<asio::detail::binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::mutable_buffer,asio::mutable_buffer_const*,asio::detail::transfer_all_t,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::handshake_op,std::_Bind<void(nuraft::rpc_session::*(nuraft::rpc_session*,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>>>,std::error_code,unsigned_long>>
              ((handler_work<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::mutable_buffer,asio::mutable_buffer_const*,asio::detail::transfer_all_t,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::handshake_op,std::_Bind<void(nuraft::rpc_session::*(nuraft::rpc_session*,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>>>,asio::any_io_executor,void>
                *)&local_f8,&local_c0,&local_c0.handler_);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&local_c0.handler_.handler_.handler_._M_bound_args.
                     super__Tuple_impl<0UL,_nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>_>
             + 8));
  execution::detail::any_executor_base::~any_executor_base(&local_f8.super_any_executor_base);
  ptr::~ptr(&local_110);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    reactive_socket_send_op* o(static_cast<reactive_socket_send_op*>(base));
    ptr p = { asio::detail::addressof(o->handler_), o, o };

    ASIO_HANDLER_COMPLETION((*o));

    // Take ownership of the operation's outstanding work.
    handler_work<Handler, IoExecutor> w(
        ASIO_MOVE_CAST2(handler_work<Handler, IoExecutor>)(
          o->work_));

    ASIO_ERROR_LOCATION(o->ec_);

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    detail::binder2<Handler, asio::error_code, std::size_t>
      handler(o->handler_, o->ec_, o->bytes_transferred_);
    p.h = asio::detail::addressof(handler.handler_);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN((handler.arg1_, handler.arg2_));
      w.complete(handler, handler.handler_);
      ASIO_HANDLER_INVOCATION_END;
    }
  }